

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  ostream *poVar2;
  vector<TCacheReq,_std::allocator<TCacheReq>_> local_188;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_131;
  string local_130;
  undefined1 local_110 [8];
  TProblem p;
  char **argv_local;
  int argc_local;
  
  p.CacheSize = (size_t)argv;
  if (argc == 3) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,pcVar1,&local_131);
    Read((TProblem *)local_110,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
    pcVar1 = *(char **)(p.CacheSize + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,pcVar1,&local_169);
    PriorityQueueAssignment(&local_188,(TProblem *)local_110);
    Write(&local_168,&local_188);
    std::vector<TCacheReq,_std::allocator<TCacheReq>_>::~vector(&local_188);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator(&local_169);
    TProblem::~TProblem((TProblem *)local_110);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"usage: ");
    poVar2 = std::operator<<(poVar2,*(char **)p.CacheSize);
    poVar2 = std::operator<<(poVar2," INPUT OUTPUT");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  argv_local._4_4_ = (uint)(argc != 3);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
    if (argc != 3) {
        std::cerr << "usage: " << argv[0] << " INPUT OUTPUT" << std::endl;
        return 1;
    }

    auto p = Read(argv[1]);

    Write(argv[2], PriorityQueueAssignment(p));

    return 0;
}